

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_GenOneHotIntervals(char *pFileName,int nPis,int nRegs,Vec_Ptr_t *vOnehots)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  
  __stream = fopen(pFileName,"w");
  uVar11 = 0;
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness with %d vars and %d regs generated by ABC on %s\n",nPis,
          (ulong)(uint)nRegs,pcVar4);
  fprintf(__stream,"# Used %d intervals of 1-hot registers: { ",(ulong)(uint)vOnehots->nSize);
  if (0 < vOnehots->nSize) {
    lVar15 = 0;
    uVar11 = 0;
    do {
      pvVar1 = vOnehots->pArray[lVar15];
      fprintf(__stream,"%d ",(ulong)*(uint *)((long)pvVar1 + 4));
      iVar5 = *(int *)((long)pvVar1 + 4);
      uVar11 = (ulong)(uint)((int)uVar11 + ((iVar5 + -1) * iVar5) / 2);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vOnehots->nSize);
  }
  fwrite("}\n",2,1,__stream);
  fprintf(__stream,".model 1hot_%dvars_%dregs\n",(ulong)(uint)nPis,(ulong)(uint)nRegs);
  fwrite(".inputs",7,1,__stream);
  uVar10 = nRegs + nPis;
  uVar14 = uVar10;
  if (1 < uVar10) {
    uVar7 = (ulong)(uVar10 - 1);
    uVar14 = 0;
    do {
      uVar8 = (uint)uVar7;
      uVar7 = uVar7 / 10;
      uVar14 = uVar14 + 1;
    } while (9 < uVar8);
  }
  if (0 < (int)uVar10) {
    uVar8 = 0;
    do {
      fprintf(__stream," i%0*d",(ulong)uVar14,(ulong)uVar8);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  fputc(10,__stream);
  fwrite(".outputs",8,1,__stream);
  uVar10 = (uint)uVar11;
  if (1 < uVar10) {
    uVar11 = 0;
    uVar8 = uVar10 - 1;
    do {
      uVar11 = (ulong)((int)uVar11 + 1);
      bVar2 = 9 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar2);
  }
  if (0 < (int)uVar10) {
    uVar8 = 0;
    do {
      fprintf(__stream," o%0*d",uVar11,(ulong)uVar8);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  fputc(10,__stream);
  iVar5 = vOnehots->nSize;
  if (iVar5 < 1) {
    uVar7 = 0;
  }
  else {
    lVar15 = 0;
    uVar7 = 0;
    do {
      pvVar1 = vOnehots->pArray[lVar15];
      iVar3 = *(int *)((long)pvVar1 + 4);
      if (0 < iVar3) {
        lVar12 = 1;
        lVar13 = 0;
        do {
          lVar9 = lVar13 + 1;
          lVar6 = (long)iVar3;
          if (lVar9 < lVar6) {
            iVar5 = *(int *)(*(long *)((long)pvVar1 + 8) + lVar13 * 4);
            lVar13 = lVar12;
            do {
              fprintf(__stream,".names i%0*d i%0*d o%0*d\n",(ulong)uVar14,
                      (ulong)(uint)(iVar5 + nPis),(ulong)uVar14,
                      (ulong)(uint)(*(int *)(*(long *)((long)pvVar1 + 8) + lVar13 * 4) + nPis),
                      uVar11,uVar7);
              fwrite("11 0\n",5,1,__stream);
              uVar7 = (ulong)((int)uVar7 + 1);
              lVar13 = lVar13 + 1;
              iVar3 = *(int *)((long)pvVar1 + 4);
            } while ((int)lVar13 < iVar3);
            lVar6 = (long)iVar3;
          }
          lVar12 = lVar12 + 1;
          lVar13 = lVar9;
        } while (lVar9 < lVar6);
        iVar5 = vOnehots->nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar5);
  }
  if (uVar10 != (uint)uVar7) {
    __assert_fail("Counter == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                  ,0x2a7,"void Abc_GenOneHotIntervals(char *, int, int, Vec_Ptr_t *)");
  }
  fwrite(".end\n",5,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vLine;
    FILE * pFile;
    int i, j, k, iReg1, iReg2, Counter, Counter2, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness with %d vars and %d regs generated by ABC on %s\n", nPis, nRegs, Extra_TimeStamp() );
    fprintf( pFile, "# Used %d intervals of 1-hot registers: { ", Vec_PtrSize(vOnehots) );
    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        fprintf( pFile, "%d ", Vec_IntSize(vLine) );
        Counter += Vec_IntSize(vLine) * (Vec_IntSize(vLine) - 1) / 2;
    }
    fprintf( pFile, "}\n" );
    fprintf( pFile, ".model 1hot_%dvars_%dregs\n", nPis, nRegs );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nPis+nRegs );
    for ( i = 0; i < nPis+nRegs; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( Counter );
    for ( i = 0; i < Counter; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter2 = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        Vec_IntForEachEntry( vLine, iReg1, i )
        Vec_IntForEachEntryStart( vLine, iReg2, j, i+1 )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, nPis+iReg1, nDigitsIn, nPis+iReg2, nDigitsOut, Counter2 ); 
            fprintf( pFile, "11 0\n" ); 
            Counter2++;
        }
    }
    assert( Counter == Counter2 );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}